

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float128 float64_to_float128_mips64el(float64 a,float_status *status)

{
  commonNaNT a_00;
  float128 fVar1;
  commonNaNT local_60;
  uint64_t local_48;
  uint64_t zSig1;
  uint64_t zSig0;
  uint64_t aSig;
  int aExp;
  flag aSign;
  float_status *status_local;
  float64 a_local;
  
  _aExp = status;
  status_local = (float_status *)a;
  status_local = (float_status *)float64_squash_input_denormal_mips64el(a,status);
  zSig0 = extractFloat64Frac((float64)status_local);
  aSig._0_4_ = extractFloat64Exp((float64)status_local);
  aSig._7_1_ = extractFloat64Sign((float64)status_local);
  if ((int)aSig == 0x7ff) {
    if (zSig0 == 0) {
      _a_local = packFloat128(aSig._7_1_,0x7fff,0,0);
    }
    else {
      float64ToCommonNaN(&local_60,(float64)status_local,_aExp);
      a_00.high = local_60.high;
      a_00.sign = local_60.sign;
      a_00._1_7_ = local_60._1_7_;
      a_00.low = local_60.low;
      _a_local = commonNaNToFloat128(a_00,_aExp);
    }
  }
  else {
    if ((int)aSig == 0) {
      if (zSig0 == 0) {
        fVar1 = packFloat128(aSig._7_1_,0,0,0);
        return fVar1;
      }
      normalizeFloat64Subnormal(zSig0,(int *)&aSig,&zSig0);
      aSig._0_4_ = (int)aSig + -1;
    }
    shift128Right(zSig0,0,4,&zSig1,&local_48);
    _a_local = packFloat128(aSig._7_1_,(int)aSig + 0x3c00,zSig1,local_48);
  }
  return _a_local;
}

Assistant:

float128 float64_to_float128(float64 a, float_status *status)
{
    flag aSign;
    int aExp;
    uint64_t aSig, zSig0, zSig1;

    a = float64_squash_input_denormal(a, status);
    aSig = extractFloat64Frac( a );
    aExp = extractFloat64Exp( a );
    aSign = extractFloat64Sign( a );
    if ( aExp == 0x7FF ) {
        if (aSig) {
            return commonNaNToFloat128(float64ToCommonNaN(a, status), status);
        }
        return packFloat128( aSign, 0x7FFF, 0, 0 );
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloat128( aSign, 0, 0, 0 );
        normalizeFloat64Subnormal( aSig, &aExp, &aSig );
        --aExp;
    }
    shift128Right( aSig, 0, 4, &zSig0, &zSig1 );
    return packFloat128( aSign, aExp + 0x3C00, zSig0, zSig1 );

}